

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageBlock
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  int iVar3;
  Type *pTVar4;
  Type *pTVar5;
  int32 iVar6;
  MessageOptions *pMVar7;
  int iVar8;
  long *local_50 [2];
  long local_40 [2];
  
  bVar2 = ConsumeEndOfDeclaration(this,"{",message_location);
  if (bVar2) {
    bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
    while (!bVar2) {
      if ((this->input_->current_).type == TYPE_END) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Reached end of input in message definition (missing \'}\').",
                   "");
        pEVar1 = this->error_collector_;
        if (pEVar1 != (ErrorCollector *)0x0) {
          (*pEVar1->_vptr_ErrorCollector[2])
                    (pEVar1,(ulong)(uint)(this->input_->current_).line,
                     (ulong)(uint)(this->input_->current_).column,local_50);
        }
        this->had_errors_ = true;
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        goto LAB_002d0006;
      }
      bVar2 = ParseMessageStatement(this,message,message_location,containing_file);
      if (!bVar2) {
        SkipStatement(this);
      }
      bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
    }
    bVar2 = true;
    if (0 < (message->extension_range_).super_RepeatedPtrFieldBase.current_size_) {
      pMVar7 = message->options_;
      if (pMVar7 == (MessageOptions *)0x0) {
        pMVar7 = (MessageOptions *)&_MessageOptions_default_instance_;
      }
      iVar8 = (pMVar7->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
      bVar2 = 0 < iVar8;
      if (0 < iVar8) {
        iVar8 = 0;
        bVar2 = true;
        do {
          pTVar4 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                             (&(pMVar7->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar8);
          if ((((pTVar4->name_).super_RepeatedPtrFieldBase.current_size_ == 1) &&
              (iVar3 = std::__cxx11::string::compare
                                 (*(char **)((long)((pTVar4->name_).super_RepeatedPtrFieldBase.rep_)
                                                   ->elements[0] + 0x18)), iVar3 == 0)) &&
             (iVar3 = std::__cxx11::string::compare((char *)(pTVar4->identifier_value_).ptr_),
             iVar3 == 0)) break;
          iVar8 = iVar8 + 1;
          iVar3 = (pMVar7->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
          bVar2 = iVar8 < iVar3;
        } while (iVar8 < iVar3);
      }
      iVar6 = 0x20000000;
      if (bVar2) {
        iVar6 = 0x7fffffff;
      }
      if (0 < (message->extension_range_).super_RepeatedPtrFieldBase.current_size_) {
        iVar8 = 0;
        do {
          pTVar5 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                             (&(message->extension_range_).super_RepeatedPtrFieldBase,iVar8);
          if (pTVar5->end_ == -1) {
            pTVar5 = internal::RepeatedPtrFieldBase::
                     Mutable<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                               (&(message->extension_range_).super_RepeatedPtrFieldBase,iVar8);
            *(byte *)(pTVar5->_has_bits_).has_bits_ = (byte)(pTVar5->_has_bits_).has_bits_[0] | 2;
            pTVar5->end_ = iVar6;
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < (message->extension_range_).super_RepeatedPtrFieldBase.current_size_);
      }
      bVar2 = true;
    }
  }
  else {
LAB_002d0006:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Parser::ParseMessageBlock(DescriptorProto* message,
                               const LocationRecorder& message_location,
                               const FileDescriptorProto* containing_file) {
  DO(ConsumeEndOfDeclaration("{", &message_location));

  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in message definition (missing '}').");
      return false;
    }

    if (!ParseMessageStatement(message, message_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  if (message->extension_range_size() > 0) {
    AdjustExtensionRangesWithMaxEndNumber(message);
  }
  return true;
}